

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricCurveSet::IfcGeometricCurveSet(IfcGeometricCurveSet *this)

{
  *(undefined ***)&(this->super_IfcGeometricSet).field_0x58 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x60 = 0;
  *(char **)&this->field_0x68 = "IfcGeometricCurveSet";
  IfcGeometricSet::IfcGeometricSet
            (&this->super_IfcGeometricSet,&PTR_construction_vtable_24__008a7a30);
  (this->super_IfcGeometricSet).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x8a7978;
  *(undefined8 *)&(this->super_IfcGeometricSet).field_0x58 = 0x8a7a18;
  *(undefined8 *)
   &(this->super_IfcGeometricSet).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x8a79a0;
  *(undefined8 *)
   &(this->super_IfcGeometricSet).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x8a79c8;
  *(undefined8 *)&(this->super_IfcGeometricSet).field_0x48 = 0x8a79f0;
  return;
}

Assistant:

IfcGeometricCurveSet() : Object("IfcGeometricCurveSet") {}